

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::ScrollArea::sizeHint(ScrollArea *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AbstractScrollAreaPrivate *pAVar5;
  AbstractScrollArea *this_00;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QSize QVar10;
  int iVar11;
  QWidget local_30 [8];
  
  pAVar5 = (this->super_AbstractScrollArea).d.d;
  QWidget::fontMetrics(local_30);
  iVar6 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_30);
  if (((pAVar5[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
      (*(int *)((long)pAVar5[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) ||
     (this_00 = pAVar5[1].q, this_00 == (AbstractScrollArea *)0x0)) {
    iVar9 = iVar6 * 0xc;
    iVar11 = iVar6 * 8;
  }
  else {
    if ((char)pAVar5[1].indicatorColor.cspec == Rgb) {
      QVar10 = (QSize)(**(code **)(*(long *)this_00 + 0x70))();
    }
    else {
      QVar10 = QWidget::size((QWidget *)this_00);
    }
    iVar9 = QVar10.wd;
    iVar11 = QVar10.ht;
  }
  iVar1 = pAVar5->left;
  iVar2 = pAVar5->right;
  iVar3 = pAVar5->top;
  iVar4 = pAVar5->bottom;
  iVar7 = QFrame::frameWidth();
  iVar8 = QFrame::frameWidth();
  iVar9 = iVar9 + iVar1 + iVar2 + iVar7 * 2;
  iVar1 = iVar6 * 0x24;
  if (iVar9 < iVar6 * 0x24) {
    iVar1 = iVar9;
  }
  iVar9 = iVar11 + iVar3 + iVar4 + iVar8 * 2;
  iVar11 = iVar6 * 0x18;
  if (iVar9 < iVar6 * 0x18) {
    iVar11 = iVar9;
  }
  QVar10.ht = iVar11;
  QVar10.wd = iVar1;
  return QVar10;
}

Assistant:

QSize
ScrollArea::sizeHint() const
{
	const ScrollAreaPrivate * d = d_func();

	QSize sz( 0, 0 );
	const int h = fontMetrics().height();

	if( d->widget )
		sz += ( d->resizable ? d->widget->sizeHint() : d->widget->size() );
	else
		sz += QSize( 12 * h, 8 * h );

	const QSize marginsSize = QSize( d->left + d->right, d->top + d->bottom );
	const QSize frameSize = QSize( frameWidth() * 2, frameWidth() * 2 );

	sz += marginsSize + frameSize;

	return sz.boundedTo( QSize( 36 * h, 24 * h ) );
}